

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O1

HANDLE CreateMutexA(LPSECURITY_ATTRIBUTES lpMutexAttributes,BOOL bInitialOwner,LPCSTR lpName)

{
  PAL_ERROR PVar1;
  CPalThread *pthr;
  PAL_ERROR *pPVar2;
  HANDLE local_30;
  HANDLE hMutex;
  
  local_30 = (HANDLE)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    pthr = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pthr == (CPalThread *)0x0) {
      pthr = CreateCurrentThreadData();
    }
    if (lpName == (LPCSTR)0x0) {
      PVar1 = CorUnix::InternalCreateMutex
                        (pthr,lpMutexAttributes,bInitialOwner,(LPCWSTR)0x0,&local_30);
    }
    else {
      fprintf(_stderr,"] %s %s:%d","CreateMutexA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
              ,0x5b);
      fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
      PVar1 = 0x32;
    }
    pPVar2 = (PAL_ERROR *)__errno_location();
    *pPVar2 = PVar1;
    if (PAL_InitializeChakraCoreCalled != false) {
      return local_30;
    }
  }
  abort();
}

Assistant:

HANDLE
PALAPI
CreateMutexA(
    IN LPSECURITY_ATTRIBUTES lpMutexAttributes,
    IN BOOL bInitialOwner,
    IN LPCSTR lpName)
{
    HANDLE hMutex = NULL;
    CPalThread *pthr = NULL;
    PAL_ERROR palError;

    PERF_ENTRY(CreateMutexA);
    ENTRY("CreateMutexA(lpMutexAttr=%p, bInitialOwner=%d, lpName=%p (%s)\n",
          lpMutexAttributes, bInitialOwner, lpName, lpName?lpName:"NULL");

    pthr = InternalGetCurrentThread();

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }
    else
    {
        palError = InternalCreateMutex(
            pthr,
            lpMutexAttributes,
            bInitialOwner,
            NULL,
            &hMutex
            );
    }

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pthr->SetLastError(palError);

    LOGEXIT("CreateMutexA returns HANDLE %p\n", hMutex);
    PERF_EXIT(CreateMutexA);
    return hMutex;
}